

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

void Gia_ObjCollectInternalCut(Gia_Man_t *p,int iRoot,Vec_Int_t *vLeaves)

{
  Vec_Int_t *p_00;
  int iVar1;
  int Id;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int i;
  
  iVar1 = Gia_ObjHasNumId(p,iRoot);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ObjHasNumId(p, iRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x26a,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
  }
  pGVar3 = Gia_ManObj(p,iRoot);
  if ((-1 < (int)(uint)*(undefined8 *)pGVar3) &&
     (((uint)*(undefined8 *)pGVar3 & 0x1fffffff) != 0x1fffffff)) {
    iVar1 = 0;
    i = 0;
    do {
      if (vLeaves->nSize <= i) {
        iVar1 = Gia_ObjHasNumId(p,iRoot);
        if (iVar1 == 0) {
          p_00 = p->vTtNodes;
          p_00->nSize = 0;
          Vec_IntPush(p_00,-1);
          Gia_ObjCollectInternalCut_rec(p,iRoot);
          return;
        }
        __assert_fail("!Gia_ObjHasNumId(p, iRoot)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                      ,0x273,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
      }
      Id = Vec_IntEntry(vLeaves,i);
      iVar2 = Gia_ObjHasNumId(p,Id);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjHasNumId(p,Id);
        if (iVar2 != 0) {
          __assert_fail("!Gia_ObjHasNumId(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                        ,0x270,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
        }
        Gia_ObjSetNumId(p,Id,iVar1);
      }
      i = i + 1;
      iVar1 = iVar1 + -1;
    } while( true );
  }
  __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iRoot))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                ,0x26b,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
}

Assistant:

void Gia_ObjCollectInternalCut( Gia_Man_t * p, int iRoot, Vec_Int_t * vLeaves )
{
    int i, iObj;
    assert( !Gia_ObjHasNumId(p, iRoot) );
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iRoot)) );
    Vec_IntForEachEntry( vLeaves, iObj, i )
    {
        if ( Gia_ObjHasNumId(p, iObj) ) // if cuts have repeated variables, skip 
            continue;
        assert( !Gia_ObjHasNumId(p, iObj) );
        Gia_ObjSetNumId( p, iObj, -i );
    }
    assert( !Gia_ObjHasNumId(p, iRoot) ); // the root cannot be one of the leaves
    Vec_IntClear( p->vTtNodes );
    Vec_IntPush( p->vTtNodes, -1 );
    Gia_ObjCollectInternalCut_rec( p, iRoot );
}